

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

void __thiscall QTabWidget::setTabsClosable(QTabWidget *this,bool closeable)

{
  byte onlyCheck;
  bool bVar1;
  QTabBar *pQVar2;
  QObject *pQVar3;
  byte in_SIL;
  QObject *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_00000047;
  QTabBar *in_stack_00000048;
  undefined7 in_stack_ffffffffffffffe0;
  QObject *this_00;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  onlyCheck = in_SIL & 1;
  this_00 = in_RDI;
  bVar1 = tabsClosable((QTabWidget *)0x6e8052);
  if (bVar1 != (bool)(onlyCheck & 1)) {
    tabBar((QTabWidget *)CONCAT17(onlyCheck,in_stack_ffffffffffffffe0));
    QTabBar::setTabsClosable(in_stack_00000048,in_stack_00000047);
    if ((onlyCheck & 1) == 0) {
      pQVar3 = (QObject *)tabBar((QTabWidget *)CONCAT17(onlyCheck,in_stack_ffffffffffffffe0));
      QObject::disconnect(pQVar3,"2tabCloseRequested(int)",in_RDI,"2tabCloseRequested(int)");
    }
    else {
      pQVar2 = tabBar((QTabWidget *)CONCAT17(onlyCheck,in_stack_ffffffffffffffe0));
      QObject::connect((QObject *)&local_10,(char *)pQVar2,(QObject *)"2tabCloseRequested(int)",
                       (char *)in_RDI,0xb1ef9b);
      QMetaObject::Connection::~Connection(&local_10);
    }
    setUpLayout((QTabWidget *)this_00,(bool)onlyCheck);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabWidget::setTabsClosable(bool closeable)
{
    if (tabsClosable() == closeable)
        return;

    tabBar()->setTabsClosable(closeable);
    if (closeable)
        connect(tabBar(), SIGNAL(tabCloseRequested(int)),
                this, SIGNAL(tabCloseRequested(int)));
    else
        disconnect(tabBar(), SIGNAL(tabCloseRequested(int)),
                  this, SIGNAL(tabCloseRequested(int)));
    setUpLayout();
}